

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall higan::EventLoop::AddTimer(EventLoop *this,Timer *timer)

{
  LogLevel LVar1;
  undefined8 uVar2;
  TimeStamp *this_00;
  undefined8 uVar3;
  string local_360;
  Fmt local_330;
  Logger local_230;
  Timer *local_18;
  Timer *timer_local;
  EventLoop *this_local;
  
  local_18 = timer;
  timer_local = (Timer *)this;
  LVar1 = Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    Logger::Logger(&local_230,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoop.cpp"
                   ,0x81,"AddTimer");
    Timer::GetName_abi_cxx11_(local_18);
    uVar2 = std::__cxx11::string::c_str();
    this_00 = Timer::GetExpireTime(local_18);
    TimeStamp::FormatToString_abi_cxx11_(&local_360,this_00);
    uVar3 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_330,"add new timer: %s expire: %s",uVar2,uVar3);
    Logger::operator<<(&local_230,&local_330);
    std::__cxx11::string::~string((string *)&local_360);
    Logger::~Logger(&local_230);
  }
  TimerManager::Insert(&this->timer_manager_,local_18);
  return;
}

Assistant:

void EventLoop::AddTimer(const Timer& timer)
{
	LOG_INFO << higan::Fmt("add new timer: %s expire: %s", timer.GetName().c_str(),
				timer.GetExpireTime().FormatToString().c_str());
	timer_manager_.Insert(timer);
}